

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read.c
# Opt level: O1

int archive_read_open1(archive *_a)

{
  archive_string_conv **ppaVar1;
  long lVar2;
  undefined8 *puVar3;
  size_t sVar4;
  code *pcVar5;
  archive_read_filter *filter;
  bool bVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  void *pvVar10;
  archive_string_conv **ppaVar11;
  size_t sVar12;
  char *fmt;
  int iVar13;
  long lVar14;
  uint uVar15;
  ulong uVar16;
  uint uVar17;
  archive_read_filter_bidder *best_bidder;
  long lVar18;
  ssize_t avail;
  long local_38;
  
  iVar8 = __archive_check_magic(_a,0xdeb0c5,1,"archive_read_open");
  if (iVar8 == -0x1e) {
    return -0x1e;
  }
  archive_clear_error(_a);
  if (_a[1].compression_name == (char *)0x0) {
    archive_set_error(_a,0x16,"No reader function provided to archive_read_open");
LAB_003a9d40:
    _a->state = 0x8000;
    iVar13 = -0x1e;
  }
  else {
    if ((*(code **)&_a[1].compression_code != (code *)0x0) &&
       (iVar8 = (**(code **)&_a[1].compression_code)
                          (_a,*(undefined8 *)(*(long *)&_a[1].current_codepage + 0x10)), iVar8 != 0)
       ) {
      if (_a[1].error_string.s == (char *)0x0) {
        return iVar8;
      }
      if ((int)_a[1].error_string.buffer_length == 0) {
        return iVar8;
      }
      lVar18 = 0x10;
      uVar16 = 0;
      do {
        (*(code *)_a[1].error_string.s)
                  (_a,*(undefined8 *)(*(long *)&_a[1].current_codepage + lVar18));
        uVar16 = uVar16 + 1;
        lVar18 = lVar18 + 0x18;
      } while (uVar16 < (uint)_a[1].error_string.buffer_length);
      return iVar8;
    }
    pvVar10 = calloc(1,0xb0);
    if (pvVar10 == (void *)0x0) {
      return -0x1e;
    }
    *(undefined8 *)((long)pvVar10 + 8) = 0;
    *(undefined8 *)((long)pvVar10 + 0x10) = 0;
    *(archive **)((long)pvVar10 + 0x18) = _a;
    puVar3 = *(undefined8 **)&_a[1].current_codepage;
    *(undefined8 *)((long)pvVar10 + 0x50) = puVar3[2];
    *(code **)((long)pvVar10 + 0x20) = client_open_proxy;
    *(code **)((long)pvVar10 + 0x28) = client_read_proxy;
    *(code **)((long)pvVar10 + 0x30) = client_skip_proxy;
    *(code **)((long)pvVar10 + 0x38) = client_seek_proxy;
    *(code **)((long)pvVar10 + 0x40) = client_close_proxy;
    *(code **)((long)pvVar10 + 0x48) = client_switch_proxy;
    *(char **)((long)pvVar10 + 0x58) = "none";
    *(undefined4 *)((long)pvVar10 + 0x60) = 0;
    *puVar3 = 0;
    sVar4 = _a[6].error_string.length;
    if ((sVar4 == 0) || ((int)_a[6].error_string.buffer_length == 0)) {
      _a[6].error_string.length = (size_t)pvVar10;
      iVar8 = 0;
      do {
        lVar14 = 0;
        lVar18 = 0;
        iVar13 = 0;
        do {
          pcVar5 = *(code **)((long)&_a[1].read_data_offset + lVar14);
          if (pcVar5 != (code *)0x0) {
            lVar2 = (long)&_a[1].sconv + lVar14;
            iVar9 = (*pcVar5)(lVar2,_a[6].error_string.length);
            if (iVar13 < iVar9) {
              lVar18 = lVar2;
              iVar13 = iVar9;
            }
          }
          lVar14 = lVar14 + 0x30;
        } while ((int)lVar14 != 0x300);
        if (lVar18 == 0) {
          __archive_read_filter_ahead((archive_read_filter *)_a[6].error_string.length,1,&local_38);
          if (local_38 < 0) {
            __archive_read_free_filters((archive_read *)_a);
            iVar13 = -0x1e;
            bVar6 = true;
          }
          else {
            sVar4 = _a[6].error_string.length;
            _a->compression_name = *(char **)(sVar4 + 0x58);
            _a->compression_code = *(int *)(sVar4 + 0x60);
            bVar6 = false;
            iVar13 = 0;
          }
          goto LAB_003a9e69;
        }
        pvVar10 = calloc(1,0xb0);
        iVar13 = -0x1e;
        bVar6 = true;
        if (pvVar10 == (void *)0x0) goto LAB_003a9e69;
        *(long *)((long)pvVar10 + 8) = lVar18;
        *(archive **)((long)pvVar10 + 0x18) = _a;
        *(size_t *)((long)pvVar10 + 0x10) = _a[6].error_string.length;
        _a[6].error_string.length = (size_t)pvVar10;
        iVar9 = (**(code **)(lVar18 + 0x18))(pvVar10);
        if (iVar9 != 0) {
          __archive_read_free_filters((archive_read *)_a);
          goto LAB_003a9e69;
        }
        iVar8 = iVar8 + 1;
      } while (iVar8 != 0x19);
      archive_set_error(_a,0x54,"Input requires too many filters for decoding");
LAB_003a9e69:
      if (bVar6) goto LAB_003a9d40;
    }
    else {
      do {
        sVar12 = sVar4;
        sVar4 = *(size_t *)(sVar12 + 0x10);
      } while (sVar4 != 0);
      *(void **)(sVar12 + 0x10) = pvVar10;
      iVar13 = 0;
    }
    if (_a[0xf].error_string.length == 0) {
      ppaVar1 = &_a[6].sconv;
      _a[0xf].error_string.length = (size_t)ppaVar1;
      uVar15 = 0;
      uVar17 = 0xffffffff;
      iVar8 = -1;
      ppaVar11 = ppaVar1;
      do {
        uVar7 = uVar17;
        iVar9 = iVar8;
        if (ppaVar11[2] != (archive_string_conv *)0x0) {
          iVar9 = (*(code *)ppaVar11[2])(_a);
          if (iVar9 == -0x1e) goto LAB_003a9f34;
          filter = (archive_read_filter *)_a[6].error_string.length;
          if (filter->position != 0) {
            __archive_read_filter_seek(filter,0,0);
          }
          uVar7 = uVar15;
          if (-1 < (int)uVar17 && iVar9 <= iVar8) {
            uVar7 = uVar17;
            iVar9 = iVar8;
          }
        }
        iVar8 = iVar9;
        uVar17 = uVar7;
        uVar15 = uVar15 + 1;
        ppaVar11 = (archive_string_conv **)(_a[0xf].error_string.length + 0x58);
        _a[0xf].error_string.length = (size_t)ppaVar11;
      } while (uVar15 != 0x10);
      if ((int)uVar17 < 0) {
        fmt = "No formats registered";
LAB_003a9f25:
        archive_set_error(_a,0x54,fmt);
LAB_003a9f34:
        uVar17 = 0xffffffe2;
      }
      else if (iVar8 < 1) {
        fmt = "Unrecognized archive format";
        goto LAB_003a9f25;
      }
      if ((int)uVar17 < 0) {
        close_filters((archive_read *)_a);
        goto LAB_003a9d40;
      }
      _a[0xf].error_string.length = (size_t)(ppaVar1 + (ulong)uVar17 * 0xb);
    }
    _a->state = 2;
    client_switch_proxy((archive_read_filter *)_a[6].error_string.length,0);
  }
  return iVar13;
}

Assistant:

int
archive_read_open1(struct archive *_a)
{
	struct archive_read *a = (struct archive_read *)_a;
	struct archive_read_filter *filter, *tmp;
	int slot, e = ARCHIVE_OK;
	unsigned int i;

	archive_check_magic(_a, ARCHIVE_READ_MAGIC, ARCHIVE_STATE_NEW,
	    "archive_read_open");
	archive_clear_error(&a->archive);

	if (a->client.reader == NULL) {
		archive_set_error(&a->archive, EINVAL,
		    "No reader function provided to archive_read_open");
		a->archive.state = ARCHIVE_STATE_FATAL;
		return (ARCHIVE_FATAL);
	}

	/* Open data source. */
	if (a->client.opener != NULL) {
		e = (a->client.opener)(&a->archive, a->client.dataset[0].data);
		if (e != 0) {
			/* If the open failed, call the closer to clean up. */
			if (a->client.closer) {
				for (i = 0; i < a->client.nodes; i++)
					(a->client.closer)(&a->archive,
					    a->client.dataset[i].data);
			}
			return (e);
		}
	}

	filter = calloc(1, sizeof(*filter));
	if (filter == NULL)
		return (ARCHIVE_FATAL);
	filter->bidder = NULL;
	filter->upstream = NULL;
	filter->archive = a;
	filter->data = a->client.dataset[0].data;
	filter->open = client_open_proxy;
	filter->read = client_read_proxy;
	filter->skip = client_skip_proxy;
	filter->seek = client_seek_proxy;
	filter->close = client_close_proxy;
	filter->sswitch = client_switch_proxy;
	filter->name = "none";
	filter->code = ARCHIVE_FILTER_NONE;

	a->client.dataset[0].begin_position = 0;
	if (!a->filter || !a->bypass_filter_bidding)
	{
		a->filter = filter;
		/* Build out the input pipeline. */
		e = choose_filters(a);
		if (e < ARCHIVE_WARN) {
			a->archive.state = ARCHIVE_STATE_FATAL;
			return (ARCHIVE_FATAL);
		}
	}
	else
	{
		/* Need to add "NONE" type filter at the end of the filter chain */
		tmp = a->filter;
		while (tmp->upstream)
			tmp = tmp->upstream;
		tmp->upstream = filter;
	}

	if (!a->format)
	{
		slot = choose_format(a);
		if (slot < 0) {
			close_filters(a);
			a->archive.state = ARCHIVE_STATE_FATAL;
			return (ARCHIVE_FATAL);
		}
		a->format = &(a->formats[slot]);
	}

	a->archive.state = ARCHIVE_STATE_HEADER;

	/* Ensure libarchive starts from the first node in a multivolume set */
	client_switch_proxy(a->filter, 0);
	return (e);
}